

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::doTargetTooHigh(Session *this,Message *msg)

{
  bool bVar1;
  IntTConvertor<unsigned_long> *pIVar2;
  uint64_t msgSeqNum_00;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  unsigned_long value_02;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  ResendRange range;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  UInt64Field *local_30;
  MsgSeqNum *msgSeqNum;
  BeginString *beginString;
  Header *header;
  Message *msg_local;
  Session *this_local;
  
  header = (Header *)msg;
  msg_local = (Message *)this;
  beginString = (BeginString *)Message::getHeader(msg);
  msgSeqNum = (MsgSeqNum *)FieldMap::getField<FIX::BeginString>((FieldMap *)beginString);
  local_30 = &FieldMap::getField<FIX::MsgSeqNum>((FieldMap *)beginString)->super_SeqNumField;
  pIVar2 = (IntTConvertor<unsigned_long> *)getExpectedTargetNum(this);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_b0,pIVar2,value);
  std::operator+(&local_90,"MsgSeqNum too high, expecting ",&local_b0);
  std::operator+(&local_70,&local_90," but received ");
  pIVar2 = (IntTConvertor<unsigned_long> *)UInt64Field::operator_cast_to_unsigned_long(local_30);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_((string *)&range.second,pIVar2,value_00);
  std::operator+(&local_50,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&range.second)
  ;
  SessionState::onEvent(&this->m_state,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&range.second);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  msgSeqNum_00 = UInt64Field::operator_cast_to_unsigned_long(local_30);
  SessionState::queue(&this->m_state,msgSeqNum_00,(Message *)header);
  bVar1 = SessionState::resendRequested(&this->m_state);
  if ((bVar1) &&
     (_local_f0 = SessionState::resendRange(&this->m_state),
     (this->m_sendRedundantResendRequests & 1U) == 0)) {
    pIVar2 = (IntTConvertor<unsigned_long> *)UInt64Field::operator_cast_to_unsigned_long(local_30);
    if ((ulong)local_f0 <= pIVar2) {
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_190,(IntTConvertor<unsigned_long> *)local_f0,value_01);
      std::operator+(&local_170,"Already sent ResendRequest FROM: ",&local_190);
      std::operator+(&local_150,&local_170," TO: ");
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_1b0,(IntTConvertor<unsigned_long> *)range.first,value_02);
      std::operator+(&local_130,&local_150,&local_1b0);
      std::operator+(&local_110,&local_130,".  Not sending another.");
      SessionState::onEvent(&this->m_state,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      return;
    }
  }
  generateResendRequest(this,(BeginString *)msgSeqNum,(MsgSeqNum *)local_30);
  return;
}

Assistant:

void Session::doTargetTooHigh(const Message &msg) {
  const Header &header = msg.getHeader();
  auto const &beginString = header.getField<BeginString>();
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  m_state.onEvent(
      "MsgSeqNum too high, expecting " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum()) + " but received "
      + SEQNUM_CONVERTOR::convert(msgSeqNum));

  m_state.queue(msgSeqNum, msg);

  if (m_state.resendRequested()) {
    SessionState::ResendRange range = m_state.resendRange();

    if (!m_sendRedundantResendRequests && msgSeqNum >= range.first) {
      m_state.onEvent(
          "Already sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(range.first)
          + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + ".  Not sending another.");
      return;
    }
  }

  generateResendRequest(beginString, msgSeqNum);
}